

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  bool bVar1;
  size_type __dnew;
  size_type local_50;
  string local_48;
  
  GetFullName(__return_storage_ptr__,this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_50 = 0x10;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
  local_48.field_2._M_allocated_capacity = local_50;
  builtin_strncpy(local_48._M_dataplus._M_p,"BUNDLE_EXTENSION",0x10);
  local_48._M_string_length = local_50;
  local_48._M_dataplus._M_p[local_50] = '\0';
  GetProperty(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (((level - ContentLevel < 2) &&
      (bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile), !bVar1)) &&
     (std::__cxx11::string::append((char *)__return_storage_ptr__), level == FullLevel)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetAppBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath =
    this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
  fpath += ".";
  const char* ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext) {
    ext = "app";
  }
  fpath += ext;
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}